

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O0

string * __thiscall
HttpTestListener::GetRequestQuery
          (string *__return_storage_ptr__,HttpTestListener *this,string *query_name)

{
  bool bVar1;
  pointer ppVar2;
  allocator<char> local_31;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *query_name_local;
  HttpTestListener *this_local;
  
  it._M_node = (_Base_ptr)query_name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->map_request_query_,query_name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->map_request_query_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpTestListener::GetRequestQuery(std::string query_name) {
  std::map<std::string, std::string>::iterator it = this->map_request_query_.find(query_name);
  if(it == this->map_request_query_.end()) {
    return "";
  } else {
    return it->second;
  }
}